

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

uint __thiscall CTransaction::GetTotalSize(CTransaction *this)

{
  size_t sVar1;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.m_params = &TX_WITH_WITNESS;
  local_18.m_object = this;
  sVar1 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint)sVar1;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CTransaction::GetTotalSize() const
{
    return ::GetSerializeSize(TX_WITH_WITNESS(*this));
}